

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

string * __thiscall
t_ocaml_generator::render_ocaml_type_abi_cxx11_
          (string *__return_storage_ptr__,t_ocaml_generator *this,t_type *type)

{
  t_type *type_00;
  int iVar1;
  t_type *ttype;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  char *pcVar2;
  string *this_00;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  ttype = t_type::get_true_type(type);
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar1 == '\0') {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar1 == '\0') {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
      if (((char)iVar1 != '\0') ||
         (iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar1 != '\0')) {
        type_name_abi_cxx11_(__return_storage_ptr__,this,ttype);
        return __return_storage_ptr__;
      }
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
      if ((char)iVar1 == '\0') {
        iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
        if ((char)iVar1 == '\0') {
          iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
          if ((char)iVar1 == '\0') goto switchD_0025baeb_default;
          render_ocaml_type_abi_cxx11_(&local_e0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
          std::operator+(__return_storage_ptr__,&local_e0," list");
          this_00 = &local_e0;
        }
        else {
          render_ocaml_type_abi_cxx11_(&local_c0,this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
          std::operator+(&local_e0,"(",&local_c0);
          std::operator+(__return_storage_ptr__,&local_e0,",bool) Hashtbl.t");
          std::__cxx11::string::~string((string *)&local_e0);
          this_00 = &local_c0;
        }
      }
      else {
        type_00 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
        render_ocaml_type_abi_cxx11_(&local_60,this,*(t_type **)&ttype[1].super_t_doc.has_doc_);
        std::operator+(&local_80,"(",&local_60);
        std::operator+(&local_c0,&local_80,",");
        render_ocaml_type_abi_cxx11_(&local_a0,this,type_00);
        std::operator+(&local_e0,&local_c0,&local_a0);
        std::operator+(__return_storage_ptr__,&local_e0,") Hashtbl.t");
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_80);
        this_00 = &local_60;
      }
    }
    else {
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      std::__cxx11::string::string((string *)&local_40,(string *)CONCAT44(extraout_var,iVar1));
      t_generator::capitalize(&local_e0,(t_generator *)this,&local_40);
      std::operator+(__return_storage_ptr__,&local_e0,".t");
      std::__cxx11::string::~string((string *)&local_e0);
      this_00 = &local_40;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    switch(*(undefined4 *)&ttype[1].super_t_doc._vptr_t_doc) {
    case 0:
      pcVar2 = "unit";
      break;
    case 1:
      pcVar2 = "string";
      break;
    case 2:
      pcVar2 = "bool";
      break;
    case 3:
    case 4:
      pcVar2 = "int";
      break;
    case 5:
      pcVar2 = "Int32.t";
      break;
    case 6:
      pcVar2 = "Int64.t";
      break;
    case 7:
      pcVar2 = "float";
      break;
    default:
switchD_0025baeb_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar1));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,(allocator *)&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_ocaml_generator::render_ocaml_type(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      return "unit";
    case t_base_type::TYPE_STRING:
      return "string";
    case t_base_type::TYPE_BOOL:
      return "bool";
    case t_base_type::TYPE_I8:
      return "int";
    case t_base_type::TYPE_I16:
      return "int";
    case t_base_type::TYPE_I32:
      return "Int32.t";
    case t_base_type::TYPE_I64:
      return "Int64.t";
    case t_base_type::TYPE_DOUBLE:
      return "float";
    }
  } else if (type->is_enum()) {
    return capitalize(((t_enum*)type)->get_name()) + ".t";
  } else if (type->is_struct() || type->is_xception()) {
    return type_name((t_struct*)type);
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    return "(" + render_ocaml_type(ktype) + "," + render_ocaml_type(vtype) + ") Hashtbl.t";
  } else if (type->is_set()) {
    t_type* etype = ((t_set*)type)->get_elem_type();
    return "(" + render_ocaml_type(etype) + ",bool) Hashtbl.t";
  } else if (type->is_list()) {
    t_type* etype = ((t_list*)type)->get_elem_type();
    return render_ocaml_type(etype) + " list";
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}